

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

void helicsFederateEnterInitializingModeIterativeComplete(HelicsFederate fed,HelicsError *err)

{
  Federate *this;
  FedObject *pFVar1;
  
  pFVar1 = helics::getFedObject(fed,err);
  if ((pFVar1 != (FedObject *)0x0) &&
     (this = (pFVar1->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr, this != (Federate *)0x0)) {
    helics::Federate::enterInitializingModeIterativeComplete(this);
  }
  return;
}

Assistant:

void helicsFederateEnterInitializingModeIterativeComplete(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->enterInitializingModeIterativeComplete();
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}